

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void raviX_ptrlist_sort(PtrList **plist,void *userdata,_func_int_void_ptr_void_ptr_void_ptr *cmp)

{
  char cVar1;
  void *pvVar2;
  PtrList *pPVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  PtrList *pPVar8;
  uint uVar9;
  long lVar10;
  PtrList *pPVar11;
  uint uVar12;
  long lVar13;
  PtrList *b;
  uint uVar14;
  ulong uVar15;
  void *buffer [14];
  uint local_10c;
  uint local_108;
  uint local_104;
  void *local_100;
  _func_int_void_ptr_void_ptr_void_ptr *local_f8;
  void **local_f0;
  PtrList *local_e8;
  PtrList *local_e0;
  PtrList *local_d8;
  PtrList *local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  PtrList **local_b8;
  PtrList *local_b0;
  void *local_a8 [15];
  
  pPVar11 = *plist;
  local_100 = userdata;
  local_f8 = cmp;
  local_e8 = pPVar11;
  local_b8 = plist;
  if (pPVar11 == (PtrList *)0x0) {
    return;
  }
  do {
    cVar1 = *(char *)pPVar11;
    if (1 < cVar1) {
      uVar15 = 1;
      lVar13 = 0;
      do {
        pvVar2 = pPVar11->list_[uVar15];
        iVar6 = (*local_f8)(local_100,pPVar11->list_[uVar15 - 1],pvVar2);
        lVar5 = lVar13;
        if (0 < iVar6) {
          do {
            lVar10 = lVar5;
            pPVar11->list_[lVar10 + 1] = pPVar11->list_[lVar10];
            if (lVar10 == 0) {
              iVar6 = 0;
              goto LAB_0010bf2f;
            }
            iVar6 = (*local_f8)(local_100,pPVar11->list_[lVar10 + -1],pvVar2);
            lVar5 = lVar10 + -1;
          } while (0 < iVar6);
          iVar6 = (int)lVar10;
LAB_0010bf2f:
          pPVar11->list_[iVar6] = pvVar2;
        }
        uVar15 = uVar15 + 1;
        lVar13 = lVar13 + 1;
      } while (uVar15 != (ushort)(short)cVar1);
    }
    verify_sorted(pPVar11,1,local_100,local_f8);
    pPVar11 = pPVar11->next_;
  } while (pPVar11 != local_e8);
  uVar14 = 1;
LAB_0010bf70:
  uVar12 = ~((int)uVar14 >> 0x1f) & uVar14;
  local_b0 = local_e8;
  local_c4 = uVar12;
  local_c0 = uVar14;
LAB_0010bf85:
  pPVar11 = local_b0;
  uVar7 = uVar14;
  if (0 < (int)uVar14) {
    do {
      pPVar11 = pPVar11->next_;
      if (pPVar11 == local_e8) {
        if (local_b0 == local_e8) {
          *local_b8 = local_e8;
          iVar6 = 1;
        }
        else {
          iVar6 = 0xb;
        }
        bVar4 = false;
        goto LAB_0010c2b5;
      }
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  uVar7 = 0;
  pPVar8 = pPVar11;
  do {
    local_bc = uVar12;
    if (uVar12 == uVar7) break;
    pPVar8 = pPVar8->next_;
    uVar7 = uVar7 + 1;
    local_bc = uVar7;
  } while (pPVar8 != local_e8);
  local_10c = 0;
  uVar12 = local_bc;
  do {
    b = local_b0;
    local_e0 = local_b0;
    if (*(char *)pPVar11 != '\0') goto LAB_0010bff3;
    pPVar11 = pPVar11->next_;
    uVar12 = uVar12 - 1;
    pPVar3 = local_b0;
  } while (uVar12 != 0);
  goto LAB_0010c265;
  while( true ) {
    uVar14 = uVar14 - 1;
    b = b->next_;
    pPVar8 = local_b0;
    if (uVar14 == 0) break;
LAB_0010bff3:
    local_b0 = pPVar8;
    if (((short)(*(int *)b << 8) != 0) &&
       (iVar6 = (*local_f8)(local_100,b->list_[(long)(short)(char)*(int *)b + -1],pPVar11->list_[0])
       , -1 < iVar6)) {
      uVar7 = 0;
      uVar9 = 0;
      local_d0 = local_e0;
      goto LAB_0010c057;
    }
  }
  local_d8 = local_e0;
  pPVar3 = local_d8;
LAB_0010c265:
  local_b0 = pPVar8;
  local_d8 = pPVar3;
  uVar14 = local_c0;
  pPVar11 = local_d8;
  verify_sorted(local_d8,local_bc + local_c0,local_100,local_f8);
  if (local_e0 == local_e8) {
    local_e8 = pPVar11;
  }
  iVar6 = 0;
  bVar4 = true;
  uVar12 = local_c4;
LAB_0010c2b5:
  if (iVar6 != 0) {
    if (iVar6 != 0xb) goto LAB_0010c2d0;
    goto LAB_0010c2cc;
  }
  if (local_b0 == local_e8) goto LAB_0010c2cc;
  goto LAB_0010bf85;
LAB_0010c057:
  if (((int)uVar7 < 0) || ((int)*(char *)b <= (int)uVar7)) {
    __assert_fail("i1 >= 0 && i1 < b1->nr_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x200,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if (((int)uVar9 < 0) || ((int)*(char *)pPVar11 <= (int)uVar9)) {
    __assert_fail("i2 >= 0 && i2 < b2->nr_",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x201,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if (b == pPVar11) {
    __assert_fail("b1 != b2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x202,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if ((int)uVar14 < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x203,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  if ((int)uVar12 < 1) {
    __assert_fail("m > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x204,
                  "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                 );
  }
  local_f0 = (void **)b->list_[(int)uVar7];
  pvVar2 = pPVar11->list_[(int)uVar9];
  local_104 = uVar7;
  iVar6 = (*local_f8)(local_100,local_f0,pvVar2);
  lVar13 = (long)(int)local_10c;
  local_10c = local_10c + 1;
  if (0 < iVar6) {
    local_a8[lVar13] = pvVar2;
    uVar9 = uVar9 + 1;
    bVar4 = true;
    uVar7 = local_104;
    if ((int)uVar9 < (int)*(char *)pPVar11) goto LAB_0010c25d;
    pPVar8 = pPVar11->prev_;
    pPVar3 = pPVar11->next_;
    pPVar3->prev_ = pPVar8;
    pPVar8->next_ = pPVar3;
    pPVar11->next_ = b;
    pPVar11->prev_ = b->prev_;
    b->prev_ = pPVar11;
    pPVar11->prev_->next_ = pPVar11;
    if (b == local_d0) {
      local_d0 = pPVar11;
    }
    local_108 = uVar9;
    flush_to(pPVar11,local_a8,(int *)&local_10c);
    pPVar11 = pPVar3->prev_;
    do {
      pPVar11 = pPVar11->next_;
      uVar7 = local_104;
      if (uVar12 == 1) {
        if (local_10c != local_104) {
          __assert_fail("nbuf == i1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                        ,0x23a,
                        "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                       );
        }
        if ((int)*(char *)b < (int)local_10c) goto LAB_0010c385;
        uVar12 = 0;
        local_f0 = b->list_;
        goto LAB_0010c23a;
      }
      uVar12 = uVar12 - 1;
    } while (*(char *)pPVar11 == '\0');
    uVar9 = 0;
    goto LAB_0010c1c2;
  }
  local_a8[lVar13] = local_f0;
  uVar7 = local_104 + 1;
  bVar4 = true;
  local_108 = uVar9;
  if ((int)*(char *)b <= (int)uVar7) {
    flush_to(b,local_a8,(int *)&local_10c);
LAB_0010c132:
    b = b->next_;
    if (uVar14 != 1) goto code_r0x0010c140;
    local_f0 = pPVar11->list_;
    if (b != pPVar11) {
      do {
        flush_to(b,local_a8,(int *)&local_10c);
        b = b->next_;
      } while (b != pPVar11);
    }
    if (local_10c != local_108) {
      __assert_fail("nbuf == i2",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                    ,0x216,
                    "PtrList *merge_block_seqs(PtrList *, int, PtrList *, int, void *, int (*)(void *, const void *, const void *))"
                   );
    }
    if ((int)*(char *)pPVar11 < (int)local_10c) {
LAB_0010c385:
      __assert_fail("nbuf <= b->nr_",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                    ,0x1d4,"void dump_to(PtrList *, void **, int)");
    }
    uVar14 = 0;
LAB_0010c23a:
    memcpy(local_f0,local_a8,(ulong)local_10c << 3);
    bVar4 = false;
    local_d8 = local_d0;
    uVar9 = local_108;
  }
  goto LAB_0010c25d;
code_r0x0010c140:
  uVar14 = uVar14 - 1;
  if (*(char *)b != '\0') goto code_r0x0010c14a;
  goto LAB_0010c132;
code_r0x0010c14a:
  uVar7 = 0;
  uVar9 = local_108;
LAB_0010c1c2:
  bVar4 = true;
LAB_0010c25d:
  pPVar3 = local_d8;
  pPVar8 = local_b0;
  if (!bVar4) goto LAB_0010c265;
  goto LAB_0010c057;
LAB_0010c2cc:
  uVar14 = uVar14 * 2;
  bVar4 = true;
LAB_0010c2d0:
  if (!bVar4) {
    return;
  }
  goto LAB_0010bf70;
}

Assistant:

void raviX_ptrlist_sort(PtrList **plist, void *userdata, int (*cmp)(void *, const void *, const void *))
{
	PtrList *head = *plist, *list = head;
	int blocks = 1;

	assert(N_ == LIST_NODE_NR);
	if (!head)
		return;

	// Sort all the sub-lists
	do {
		array_sort(list->list_, list->nr_, userdata, cmp);
#ifdef PARANOIA
		verify_sorted(list, 1, userdata, cmp);
#endif
		list = list->next_;
	} while (list != head);

	// Merge the damn things together
	while (1) {
		PtrList *block1 = head;

		do {
			PtrList *block2 = block1;
			PtrList *next, *newhead;
			int i;

			for (i = 0; i < blocks; i++) {
				block2 = block2->next_;
				if (block2 == head) {
					if (block1 == head) {
						// BEEN_THERE('A');
						*plist = head;
						return;
					}
					// BEEN_THERE('B');
					goto next_pass;
				}
			}

			next = block2;
			for (i = 0; i < blocks;) {
				next = next->next_;
				i++;
				if (next == head) {
					// BEEN_THERE('C');
					break;
				}
				// BEEN_THERE('D');
			}

			newhead = merge_block_seqs(block1, blocks, block2, i, userdata, cmp);
#ifdef PARANOIA
			verify_sorted(newhead, blocks + i, userdata, cmp);
#endif
			if (block1 == head) {
				// BEEN_THERE('E');
				head = newhead;
			}
			block1 = next;
		} while (block1 != head);
	next_pass:
		blocks <<= 1;
	}
}